

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpressionGenerator.cpp
# Opt level: O0

void __thiscall rsg::ExpressionGenerator::generate(ExpressionGenerator *this,Expression *root)

{
  GeneratorState *pGVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference ppEVar5;
  undefined4 extraout_var;
  value_type local_28;
  Expression *child;
  Expression *curExpr;
  Expression *root_local;
  ExpressionGenerator *this_local;
  
  curExpr = root;
  root_local = (Expression *)this;
  std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::push_back
            (&this->m_expressionStack,&curExpr);
  pGVar1 = this->m_state;
  iVar3 = GeneratorState::getExpressionDepth(this->m_state);
  GeneratorState::setExpressionDepth(pGVar1,iVar3 + 1);
  while (bVar2 = std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::empty
                           (&this->m_expressionStack), ((bVar2 ^ 0xffU) & 1) != 0) {
    sVar4 = std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::size
                      (&this->m_expressionStack);
    ppEVar5 = std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::operator[]
                        (&this->m_expressionStack,sVar4 - 1);
    child = *ppEVar5;
    iVar3 = (*child->_vptr_Expression[2])(child,this->m_state);
    local_28 = (value_type)CONCAT44(extraout_var,iVar3);
    if (local_28 == (value_type)0x0) {
      std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::pop_back
                (&this->m_expressionStack);
      pGVar1 = this->m_state;
      iVar3 = GeneratorState::getExpressionDepth(this->m_state);
      GeneratorState::setExpressionDepth(pGVar1,iVar3 + -1);
    }
    else {
      std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::push_back
                (&this->m_expressionStack,&local_28);
      pGVar1 = this->m_state;
      iVar3 = GeneratorState::getExpressionDepth(this->m_state);
      GeneratorState::setExpressionDepth(pGVar1,iVar3 + 1);
    }
  }
  return;
}

Assistant:

void ExpressionGenerator::generate (Expression* root)
{
	DE_ASSERT(m_expressionStack.empty());

	// Initialize stack
	m_expressionStack.push_back(root);
	m_state.setExpressionDepth(m_state.getExpressionDepth()+1);

	// Process until done
	while (!m_expressionStack.empty())
	{
		DE_ASSERT(m_state.getExpressionDepth() <= m_state.getShaderParameters().maxExpressionDepth);

		Expression* curExpr = m_expressionStack[m_expressionStack.size()-1];
		Expression*	child	= curExpr->createNextChild(m_state);

		if (child)
		{
			m_expressionStack.push_back(child);
			m_state.setExpressionDepth(m_state.getExpressionDepth()+1);
		}
		else
		{
			m_expressionStack.pop_back();
			m_state.setExpressionDepth(m_state.getExpressionDepth()-1);
		}
	}
}